

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# issue.cpp
# Opt level: O3

string * __thiscall
libcellml::Issue::description_abi_cxx11_(string *__return_storage_ptr__,Issue *this)

{
  IssueImpl *pIVar1;
  pointer pcVar2;
  
  pIVar1 = this->mPimpl;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar2 = (pIVar1->mDescription)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar2,
             pcVar2 + (pIVar1->mDescription)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string Issue::description() const
{
    return mPimpl->mDescription;
}